

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_amplification(Impl *this)

{
  bool bVar1;
  Builder *this_00;
  MDOperand *pMVar2;
  MDNode *pMVar3;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addExtension(this_00,"SPV_EXT_mesh_shader");
  spv::Builder::addCapability(this_00,CapabilityMeshShadingEXT);
  pMVar2 = get_shader_property_tag(this->entry_point_meta,ASState);
  if (pMVar2 != (MDOperand *)0x0) {
    pMVar3 = LLVMBC::cast<LLVMBC::MDNode>(pMVar2);
    pMVar2 = LLVMBC::MDNode::getOperand(pMVar3,0);
    pMVar3 = LLVMBC::cast<LLVMBC::MDNode>(pMVar2);
    bVar1 = emit_execution_modes_thread_wave_properties(this,pMVar3);
    return bVar1;
  }
  return false;
}

Assistant:

bool Converter::Impl::emit_execution_modes_amplification()
{
	auto &builder = spirv_module.get_builder();

	builder.addExtension("SPV_EXT_mesh_shader");
	builder.addCapability(spv::CapabilityMeshShadingEXT);

	auto *as_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::ASState);

	if (as_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*as_state_node);
		auto *num_threads = llvm::cast<llvm::MDNode>(arguments->getOperand(0));
		return emit_execution_modes_thread_wave_properties(num_threads);
	}
	else
		return false;
}